

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

void __thiscall io_buf::reset_file(io_buf *this,int f)

{
  char *pcVar1;
  char **ppcVar2;
  int in_ESI;
  long in_RDI;
  
  lseek64(in_ESI,0,0);
  ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
  pcVar1 = *ppcVar2;
  ppcVar2 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
  *ppcVar2 = pcVar1;
  ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
  *(char **)(in_RDI + 0x60) = *ppcVar2;
  return;
}

Assistant:

virtual void reset_file(int f)
  {
#ifdef _WIN32
    _lseek(f, 0, SEEK_SET);
#else
    lseek(f, 0, SEEK_SET);
#endif
    space.end() = space.begin();
    head = space.begin();
  }